

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void lua_close(lua_State *L)

{
  global_State *g_00;
  lua_State *L_00;
  int iVar1;
  TValue *pTVar2;
  int local_1c;
  int i;
  global_State *g;
  lua_State *L_local;
  
  g_00 = (global_State *)(L->glref).ptr64;
  L_00 = (lua_State *)(g_00->mainthref).gcptr64;
  luaJIT_profile_stop(L_00);
  (g_00->cur_L).gcptr64 = 0;
  lj_func_closeuv(L_00,(TValue *)(L_00->stack).ptr64);
  lj_gc_separateudata(g_00,1);
  g_00[1].str.id = g_00[1].str.id & 0xfffffffe;
  g_00[1].tmptv.field_4.it = 0;
  lj_dispatch_update(g_00);
  local_1c = 0;
  do {
    do {
      g_00->hookmask = g_00->hookmask | 0x10;
      L_00->status = '\0';
      pTVar2 = (TValue *)((L_00->stack).ptr64 + 0x10);
      L_00->top = pTVar2;
      L_00->base = pTVar2;
      L_00->cframe = (void *)0x0;
      iVar1 = lj_vm_cpcall(L_00,0,0,cpfinalize);
    } while (iVar1 != 0);
    local_1c = local_1c + 1;
  } while ((local_1c < 10) && (lj_gc_separateudata(g_00,1), (g_00->gc).mmudata.gcptr64 != 0));
  close_state(L_00);
  return;
}

Assistant:

LUA_API void lua_close(lua_State *L)
{
  global_State *g = G(L);
  int i;
  L = mainthread(g);  /* Only the main thread can be closed. */
#if LJ_HASPROFILE
  luaJIT_profile_stop(L);
#endif
  setgcrefnull(g->cur_L);
  lj_func_closeuv(L, tvref(L->stack));
  lj_gc_separateudata(g, 1);  /* Separate udata which have GC metamethods. */
#if LJ_HASJIT
  G2J(g)->flags &= ~JIT_F_ON;
  G2J(g)->state = LJ_TRACE_IDLE;
  lj_dispatch_update(g);
#endif
  for (i = 0;;) {
    hook_enter(g);
    L->status = LUA_OK;
    L->base = L->top = tvref(L->stack) + 1 + LJ_FR2;
    L->cframe = NULL;
    if (lj_vm_cpcall(L, NULL, NULL, cpfinalize) == LUA_OK) {
      if (++i >= 10) break;
      lj_gc_separateudata(g, 1);  /* Separate udata again. */
      if (gcref(g->gc.mmudata) == NULL)  /* Until nothing is left to do. */
	break;
    }
  }
  close_state(L);
}